

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AdvancedMath.hpp
# Opt level: O3

bool Diligent::CheckLineSectionOverlap<true,unsigned_int>(uint Min0,uint Max0,uint Min1,uint Max1)

{
  undefined4 in_register_0000000c;
  string msg;
  string local_48;
  
  if (Max0 < Min0 || Min1 > Max1) {
    FormatString<char[26],char[29]>
              (&local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Min0 <= Max0 && Min1 <= Max1",
               (char (*) [29])
               CONCAT71((int7)(CONCAT44(in_register_0000000c,Max1) >> 8),Min1 <= Max1));
    DebugAssertionFailed
              (local_48._M_dataplus._M_p,"CheckLineSectionOverlap",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/AdvancedMath.hpp"
               ,0x4c6);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  return Min1 <= Max0 && Min0 <= Max1;
}

Assistant:

bool CheckLineSectionOverlap(T Min0, T Max0, T Min1, T Max1)
{
    VERIFY_EXPR(Min0 <= Max0 && Min1 <= Max1);
    //     [------]         [------]
    //   Min0    Max0    Min1     Max1
    //
    //     [------]         [------]
    //   Min1    Max1    Min0     Max0
    if (AllowTouch)
    {
        return !(Min0 > Max1 || Min1 > Max0);
    }
    else
    {
        return !(Min0 >= Max1 || Min1 >= Max0);
    }
}